

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

optional<wasm::HeapType> wasm::HeapType::getLeastUpperBound(HeapType a,HeapType b)

{
  _Storage<wasm::HeapType,_true> _Var1;
  bool bVar2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  _Storage<wasm::HeapType,_true> _Var5;
  _Storage<wasm::HeapType,_true> _Var6;
  undefined8 unaff_R14;
  ulong uVar7;
  _Storage<wasm::HeapType,_true> _Var8;
  pair<std::__detail::_Node_iterator<wasm::(anonymous_namespace)::HeapTypeInfo_*,_true,_false>,_bool>
  pVar9;
  optional<wasm::HeapType> oVar10;
  undefined1 local_98 [8];
  unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
  seen;
  HeapTypeInfo *infoA;
  HeapTypeInfo *infoB;
  HeapTypeInfo *nextA;
  HeapTypeInfo *nextB;
  HeapType a_local;
  HeapType b_local;
  
  uVar7 = CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
  if (a.id != b.id) {
    nextB = (HeapTypeInfo *)a.id;
    a_local = b;
    BVar3 = getBottom((HeapType *)&nextB);
    a.id._4_4_ = 0;
    a.id._0_4_ = BVar3;
    BVar4 = getBottom(&a_local);
    if (BVar3 == BVar4) {
      bVar2 = isBottom((HeapType *)&nextB);
      a = a_local;
      if ((!bVar2) && (bVar2 = isBottom(&a_local), a.id = (uintptr_t)nextB, !bVar2)) {
        if (((HeapTypeInfo *)0x7c < nextB) && (0x7c < a_local.id)) {
          _Var5 = (_Storage<wasm::HeapType,_true>)anon_unknown_0::getHeapTypeInfo((HeapType)nextB);
          seen._M_h._M_single_bucket = (__node_base_ptr)_Var5;
          _Var6 = (_Storage<wasm::HeapType,_true>)anon_unknown_0::getHeapTypeInfo(a_local);
          infoA = (HeapTypeInfo *)_Var6;
          if (*(HeapTypeKind *)((long)_Var5 + 0x30) == *(HeapTypeKind *)((long)_Var6 + 0x30)) {
            local_98 = (undefined1  [8])&seen._M_h._M_rehash_policy._M_next_resize;
            seen._M_h._M_buckets = (__buckets_ptr)0x1;
            seen._M_h._M_bucket_count = 0;
            seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            seen._M_h._M_element_count._0_4_ = 0x3f800000;
            seen._M_h._M_rehash_policy._M_max_load_factor = 0.0;
            seen._M_h._M_rehash_policy._4_4_ = 0;
            seen._M_h._M_rehash_policy._M_next_resize = 0;
            std::
            unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
            ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                      *)local_98,(value_type *)&seen._M_h._M_single_bucket);
            std::
            unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
            ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                      *)local_98,&infoA);
            do {
              a.id = (((_Storage<wasm::HeapType,_true> *)((long)_Var5 + 8))->_M_value).id;
              _Var1 = *(_Storage<wasm::HeapType,_true> *)((long)_Var6 + 8);
              infoB = (HeapTypeInfo *)a.id;
              nextA = (HeapTypeInfo *)_Var1;
              if ((_Storage<wasm::HeapType,_true>)a.id == (_Storage<wasm::HeapType,_true>)0x0 &&
                  _Var1 == (_Storage<wasm::HeapType,_true>)0x0) {
                BVar3 = anon_unknown_0::getBasicHeapSupertype((HeapType)nextB);
                BVar4 = anon_unknown_0::getBasicHeapSupertype(a_local);
                oVar10 = anon_unknown_0::getBasicHeapTypeLUB(BVar3,BVar4);
                a.id = oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
                uVar7 = (ulong)oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._8_4_;
                goto LAB_00cf9c14;
              }
              _Var8 = _Var5;
              if (((_Storage<wasm::HeapType,_true>)a.id != (_Storage<wasm::HeapType,_true>)0x0) &&
                 (pVar9 = std::
                          unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                          ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                    *)local_98,&infoB), _Var8 = (_Storage<wasm::HeapType,_true>)a.id
                 , ((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
                uVar7 = CONCAT71(_Var5._1_7_,1);
                goto LAB_00cf9c14;
              }
              _Var5 = _Var8;
            } while ((_Var1 == (_Storage<wasm::HeapType,_true>)0x0) ||
                    (pVar9 = std::
                             unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                             ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                       *)local_98,&nextA), _Var6 = _Var1,
                    ((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0));
            uVar7 = CONCAT71(_Var8._1_7_,1);
            a.id = (uintptr_t)_Var1;
LAB_00cf9c14:
            std::
            unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
            ::~unordered_set((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                              *)local_98);
            goto LAB_00cf9abc;
          }
        }
        BVar3 = anon_unknown_0::getBasicHeapSupertype((HeapType)nextB);
        BVar4 = anon_unknown_0::getBasicHeapSupertype(a_local);
        oVar10 = anon_unknown_0::getBasicHeapTypeLUB(BVar3,BVar4);
        a.id = oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
        uVar7 = (ulong)oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._8_4_;
      }
    }
    else {
      uVar7 = 0;
    }
  }
LAB_00cf9abc:
  oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = uVar7 & 0xffffffff;
  oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)a.id;
  return (optional<wasm::HeapType>)
         oVar10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> HeapType::getLeastUpperBound(HeapType a, HeapType b) {
  if (a == b) {
    return a;
  }
  if (a.getBottom() != b.getBottom()) {
    return {};
  }
  if (a.isBottom()) {
    return b;
  }
  if (b.isBottom()) {
    return a;
  }
  if (a.isBasic() || b.isBasic()) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  auto* infoA = getHeapTypeInfo(a);
  auto* infoB = getHeapTypeInfo(b);

  if (infoA->kind != infoB->kind) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  // Walk up the subtype tree to find the LUB. Ascend the tree from both `a`
  // and `b` in lockstep. The first type we see for a second time must be the
  // LUB because there are no cycles and the only way to encounter a type
  // twice is for it to be on the path above both `a` and `b`.
  std::unordered_set<HeapTypeInfo*> seen;
  seen.insert(infoA);
  seen.insert(infoB);
  while (true) {
    auto* nextA = infoA->supertype;
    auto* nextB = infoB->supertype;
    if (nextA == nullptr && nextB == nullptr) {
      // Did not find a LUB in the subtype tree.
      return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                                 getBasicHeapSupertype(b));
    }
    if (nextA) {
      if (!seen.insert(nextA).second) {
        return HeapType(uintptr_t(nextA));
      }
      infoA = nextA;
    }
    if (nextB) {
      if (!seen.insert(nextB).second) {
        return HeapType(uintptr_t(nextB));
      }
      infoB = nextB;
    }
  }
}